

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::ninjaVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  char *command_00;
  string local_60;
  undefined1 local_40 [8];
  string command;
  cmGlobalNinjaGenerator *this_local;
  string *version;
  
  command.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  ninjaCmd_abi_cxx11_(&local_60,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60," --version");
  std::__cxx11::string::~string((string *)&local_60);
  command_00 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::RunSingleCommand
            (command_00,__return_storage_ptr__,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,0.0)
  ;
  command.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((command.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaVersion() const
{
  std::string version;
  std::string command = ninjaCmd() + " --version";
  cmSystemTools::RunSingleCommand(command.c_str(),
                                  &version, 0, 0, 0,
                                  cmSystemTools::OUTPUT_NONE);

  return version;
}